

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HBondRvol.cpp
# Opt level: O3

void __thiscall OpenMD::HBondRvol::writeDensityR(HBondRvol *this)

{
  char cVar1;
  int iVar2;
  int iVar3;
  ostream *poVar4;
  ulong uVar5;
  double dVar6;
  ofstream qRstream;
  DumpReader reader;
  long local_1488;
  filebuf local_1480 [240];
  ios_base local_1390 [264];
  DumpReader local_1288;
  
  DumpReader::DumpReader
            (&local_1288,(this->super_StaticAnalyser).info_,
             &(this->super_StaticAnalyser).dumpFilename_);
  iVar2 = DumpReader::getNFrames(&local_1288);
  std::ofstream::ofstream
            (&local_1488,(this->super_StaticAnalyser).outputFilename_._M_dataplus._M_p,_S_out);
  cVar1 = std::__basic_file<char>::is_open();
  if (cVar1 == '\0') {
    snprintf(painCave.errMsg,2000,"HBondRvol: unable to open %s\n",
             (this->super_StaticAnalyser).outputFilename_._M_dataplus._M_p);
    painCave.isFatal = 1;
    simError();
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1488,"# ",2);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&local_1488,
                        (this->super_StaticAnalyser).analysisType_._M_dataplus._M_p,
                        (this->super_StaticAnalyser).analysisType_._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1488,"#selection 1: (",0xf)
    ;
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&local_1488,(this->selectionScript1_)._M_dataplus._M_p,
                        (this->selectionScript1_)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,")\n",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1488,"#selection 2: (",0xf)
    ;
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&local_1488,(this->selectionScript2_)._M_dataplus._M_p,
                        (this->selectionScript2_)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,")\n",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1488,"#selection 3: (",0xf)
    ;
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&local_1488,(this->selectionScript3_)._M_dataplus._M_p,
                        (this->selectionScript3_)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,")\n",2);
    if ((this->super_StaticAnalyser).paramString_._M_string_length != 0) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1488,"# parameters: ",0xe);
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&local_1488,
                          (this->super_StaticAnalyser).paramString_._M_dataplus._M_p,
                          (this->super_StaticAnalyser).paramString_._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1488,"#distance",9);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1488,"\tH Bonds\n",9);
    if ((this->sliceQ_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_finish !=
        (this->sliceQ_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start) {
      uVar5 = 0;
      do {
        dVar6 = ((double)uVar5 + 0.5) * this->deltaR_;
        iVar3 = (int)(dVar6 * dVar6 * 12.566370614359172 * this->deltaR_);
        (this->binvol_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start[uVar5] = iVar3;
        if (((this->sliceCount_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start[uVar5] == 0) || (iVar3 == 0)) {
          poVar4 = std::ostream::_M_insert<double>(dVar6);
          std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\t",1);
          poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,0);
        }
        else {
          poVar4 = std::ostream::_M_insert<double>(dVar6);
          std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\t",1);
          poVar4 = std::ostream::_M_insert<double>
                             (((this->sliceQ_).super__Vector_base<double,_std::allocator<double>_>.
                               _M_impl.super__Vector_impl_data._M_start[uVar5] /
                              (double)(this->binvol_).super__Vector_base<int,_std::allocator<int>_>.
                                      _M_impl.super__Vector_impl_data._M_start[uVar5]) /
                              (double)iVar2);
        }
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
        uVar5 = (ulong)((int)uVar5 + 1);
      } while (uVar5 < (ulong)((long)(this->sliceQ_).
                                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                     super__Vector_impl_data._M_finish -
                               (long)(this->sliceQ_).
                                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                     super__Vector_impl_data._M_start >> 3));
    }
  }
  std::ofstream::close();
  local_1488 = _VTT;
  *(undefined8 *)(local_1480 + *(long *)(_VTT + -0x18) + -8) = ___throw_bad_array_new_length;
  std::filebuf::~filebuf(local_1480);
  std::ios_base::~ios_base(local_1390);
  DumpReader::~DumpReader(&local_1288);
  return;
}

Assistant:

void HBondRvol::writeDensityR() {
    // compute average box length:

    double pi = acos(-1.0);
    DumpReader reader(info_, dumpFilename_);
    int nFrames = reader.getNFrames();
    std::ofstream qRstream(outputFilename_.c_str());
    if (qRstream.is_open()) {
      qRstream << "# " << getAnalysisType() << "\n";
      qRstream << "#selection 1: (" << selectionScript1_ << ")\n";
      qRstream << "#selection 2: (" << selectionScript2_ << ")\n";
      qRstream << "#selection 3: (" << selectionScript3_ << ")\n";
      if (!paramString_.empty())
        qRstream << "# parameters: " << paramString_ << "\n";

      qRstream << "#distance"
               << "\tH Bonds\n";
      for (unsigned int i = 0; i < sliceQ_.size(); ++i) {
        RealType Rval = (i + 0.5) * deltaR_;
        binvol_[i]    = (4 * pi * (Rval * Rval) * deltaR_);
        if (sliceCount_[i] != 0 && binvol_[i] != 0) {
          qRstream << Rval << "\t" << sliceQ_[i] / (binvol_[i]) / nFrames
                   << "\n";
        } else {
          qRstream << Rval << "\t" << 0 << "\n";
        }
      }

    } else {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "HBondRvol: unable to open %s\n", outputFilename_.c_str());
      painCave.isFatal = 1;
      simError();
    }
    qRstream.close();
  }